

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O1

int default_stream_scheduler_do_send
              (quicly_stream_scheduler_t *self,quicly_conn_t *conn,quicly_send_context_t *s)

{
  st_quicly_default_scheduler_state_t *sched;
  quicly_linklist_t *pqVar1;
  quicly_stream_t *stream;
  st_quicly_linklist_t *psVar2;
  st_quicly_linklist_t *psVar3;
  bool bVar4;
  int conn_is_blocked;
  int iVar5;
  int iVar6;
  
  sched = &(conn->super)._default_scheduler;
  conn_is_blocked = quicly_is_blocked(conn);
  if ((conn_is_blocked == 0) &&
     (pqVar1 = &(conn->super)._default_scheduler.blocked,
     (conn->super)._default_scheduler.blocked.prev != pqVar1)) {
    ((conn->super)._default_scheduler.blocked.next)->prev = &sched->active;
    psVar2 = (conn->super)._default_scheduler.blocked.prev;
    psVar2->next = (conn->super)._default_scheduler.active.next;
    ((conn->super)._default_scheduler.active.next)->prev = psVar2;
    (conn->super)._default_scheduler.active.next = (conn->super)._default_scheduler.blocked.next;
    (conn->super)._default_scheduler.blocked.next = pqVar1;
    (conn->super)._default_scheduler.blocked.prev = pqVar1;
  }
  iVar6 = 0;
  do {
    iVar5 = quicly_can_send_data(conn,s);
    if (iVar5 == 0) {
      return iVar6;
    }
    if ((st_quicly_default_scheduler_state_t *)(sched->active).prev == sched) {
      return iVar6;
    }
    psVar2 = (conn->super)._default_scheduler.active.next;
    stream = (quicly_stream_t *)(psVar2 + -0x11);
    psVar3 = psVar2->prev;
    psVar3->next = psVar2->next;
    psVar2->next->prev = psVar3;
    psVar2->next = psVar2;
    psVar2->prev = psVar2;
    if ((conn_is_blocked == 0) || (iVar5 = quicly_stream_can_send(stream,0), iVar5 != 0)) {
      iVar6 = quicly_send_stream(stream,s);
      if (iVar6 == 0) {
        conn_is_blocked = quicly_is_blocked(conn);
        iVar6 = quicly_stream_can_send(stream,1);
        if (iVar6 != 0) {
          link_stream(sched,stream,conn_is_blocked);
        }
        iVar6 = 0;
        goto LAB_0011aa87;
      }
      bVar4 = true;
      if (iVar6 == 0xff02) {
        iVar5 = quicly_stream_can_send(stream,1);
        if (iVar5 == 0) {
          __assert_fail("quicly_stream_can_send(stream, 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                        ,0x137,
                        "int default_stream_scheduler_do_send(quicly_stream_scheduler_t *, quicly_conn_t *, quicly_send_context_t *)"
                       );
        }
        link_stream(sched,stream,conn_is_blocked);
      }
    }
    else {
      if (psVar2->prev != psVar2) {
        __assert_fail("!quicly_linklist_is_linked(n)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/linklist.h"
                      ,0x38,"void quicly_linklist_insert(quicly_linklist_t *, quicly_linklist_t *)")
        ;
      }
      psVar3 = (conn->super)._default_scheduler.blocked.prev;
      psVar2->prev = psVar3;
      psVar2->next = psVar3->next;
      psVar3->next = psVar2;
      psVar2->next->prev = psVar2;
LAB_0011aa87:
      bVar4 = false;
    }
    if (bVar4) {
      return iVar6;
    }
  } while( true );
}

Assistant:

static int default_stream_scheduler_do_send(quicly_stream_scheduler_t *self, quicly_conn_t *conn, quicly_send_context_t *s)
{
    struct st_quicly_default_scheduler_state_t *sched = &((struct _st_quicly_conn_public_t *)conn)->_default_scheduler;
    int conn_is_blocked = quicly_is_blocked(conn), ret = 0;

    if (!conn_is_blocked)
        quicly_linklist_insert_list(&sched->active, &sched->blocked);

    while (quicly_can_send_data((quicly_conn_t *)conn, s) && quicly_linklist_is_linked(&sched->active)) {
        /* detach the first active stream */
        quicly_stream_t *stream =
            (void *)((char *)sched->active.next - offsetof(quicly_stream_t, _send_aux.pending_link.default_scheduler));
        quicly_linklist_unlink(&stream->_send_aux.pending_link.default_scheduler);
        /* relink the stream to the blocked list if necessary */
        if (conn_is_blocked && !quicly_stream_can_send(stream, 0)) {
            quicly_linklist_insert(sched->blocked.prev, &stream->_send_aux.pending_link.default_scheduler);
            continue;
        }
        /* send! */
        if ((ret = quicly_send_stream(stream, s)) != 0) {
            /* FIXME Stop quicly_send_stream emitting SENDBUF_FULL (happpens when CWND is congested). Otherwise, we need to make
             * adjustments to the scheduler after popping a stream */
            if (ret == QUICLY_ERROR_SENDBUF_FULL) {
                assert(quicly_stream_can_send(stream, 1));
                link_stream(sched, stream, conn_is_blocked);
            }
            break;
        }
        /* reschedule */
        conn_is_blocked = quicly_is_blocked(conn);
        if (quicly_stream_can_send(stream, 1))
            link_stream(sched, stream, conn_is_blocked);
    }

    return ret;
}